

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeprovider.cpp
# Opt level: O2

void __thiscall QMimeBinaryProvider::ensureLoaded(QMimeBinaryProvider *this)

{
  unique_ptr<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
  *this_00;
  QString *__p;
  bool bVar1;
  long in_FS_OFFSET;
  QStringBuilder<QString_&,_QLatin1String> local_50;
  QArrayDataPointer<char16_t> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->m_cacheFile;
  if ((this->m_cacheFile)._M_t.
      super___uniq_ptr_impl<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
      ._M_t.
      super__Tuple_impl<0UL,_QMimeBinaryProvider::CacheFile_*,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
      .super__Head_base<0UL,_QMimeBinaryProvider::CacheFile_*,_false>._M_head_impl ==
      (CacheFile *)0x0) {
    local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_38.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    local_50.a = &(this->super_QMimeProviderBase).m_directory;
    local_50.b.m_size = 0xb;
    local_50.b.m_data = "/mime.cache";
    QStringBuilder<QString_&,_QLatin1String>::convertTo<QString>((QString *)&local_38,&local_50);
    std::make_unique<QMimeBinaryProvider::CacheFile,QString_const&>((QString *)&local_50);
    __p = local_50.a;
    local_50.a = (QString *)0x0;
    std::
    __uniq_ptr_impl<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
    ::reset((__uniq_ptr_impl<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
             *)this_00,(pointer)__p);
    std::
    unique_ptr<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
    ::~unique_ptr((unique_ptr<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
                   *)&local_50);
    this->m_mimetypeListLoaded = false;
    std::
    _Rb_tree<QString,_std::pair<const_QString,_QMimeBinaryProvider::MimeTypeExtra>,_std::_Select1st<std::pair<const_QString,_QMimeBinaryProvider::MimeTypeExtra>_>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMimeBinaryProvider::MimeTypeExtra>_>_>
    ::clear(&(this->m_mimetypeExtra)._M_t);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  }
  else {
    bVar1 = checkCacheChanged(this);
    if (!bVar1) goto LAB_004483d7;
    this->m_mimetypeListLoaded = false;
    std::
    _Rb_tree<QString,_std::pair<const_QString,_QMimeBinaryProvider::MimeTypeExtra>,_std::_Select1st<std::pair<const_QString,_QMimeBinaryProvider::MimeTypeExtra>_>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMimeBinaryProvider::MimeTypeExtra>_>_>
    ::clear(&(this->m_mimetypeExtra)._M_t);
  }
  if (((this_00->_M_t).
       super___uniq_ptr_impl<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
       ._M_t.
       super__Tuple_impl<0UL,_QMimeBinaryProvider::CacheFile_*,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
       .super__Head_base<0UL,_QMimeBinaryProvider::CacheFile_*,_false>._M_head_impl)->m_valid ==
      false) {
    std::
    __uniq_ptr_impl<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
    ::reset((__uniq_ptr_impl<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
             *)this_00,(pointer)0x0);
  }
LAB_004483d7:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMimeBinaryProvider::ensureLoaded()
{
    if (!m_cacheFile) {
        const QString cacheFileName = m_directory + "/mime.cache"_L1;
        m_cacheFile = std::make_unique<CacheFile>(cacheFileName);
        m_mimetypeListLoaded = false;
        m_mimetypeExtra.clear();
    } else {
        if (checkCacheChanged()) {
            m_mimetypeListLoaded = false;
            m_mimetypeExtra.clear();
        } else {
            return; // nothing to do
        }
    }
    if (!m_cacheFile->isValid()) // verify existence and version
        m_cacheFile.reset();
}